

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::reti(GB *this)

{
  u8 uVar1;
  GB *this_local;
  
  switch((this->s).op_tick) {
  case 6:
    (this->s).ime_enable = false;
    (this->s).ime = true;
    break;
  case 0xe:
    uVar1 = pop(this);
    (this->s).field_6.field_0.z = uVar1;
    break;
  case 0x16:
    uVar1 = pop(this);
    (this->s).field_6.field_0.w = uVar1;
    break;
  case 0x1e:
    (this->s).pc = (u16)(this->s).field_6;
    op_done(this);
  }
  return;
}

Assistant:

void GB::reti() {
  switch (s.op_tick) {
    case 6: s.ime_enable = false; s.ime = true; break;
    case 14: s.z = pop(); break;
    case 22: s.w = pop(); break;
    case 30: s.pc = s.wz; op_done(); break;
  }
}